

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_treenode.cc
# Opt level: O1

NodePtr __thiscall dh::TreeNode::getSibling(TreeNode *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  element_type *in_RDI;
  NodePtr NVar2;
  NodePtr NVar3;
  
  (in_RDI->_children).
  super__Vector_base<std::shared_ptr<dh::TreeNode>,_std::allocator<std::shared_ptr<dh::TreeNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)(this->_sibling).super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Var1 = (this->_sibling).super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (in_RDI->_children).
  super__Vector_base<std::shared_ptr<dh::TreeNode>,_std::allocator<std::shared_ptr<dh::TreeNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (NodePtr)NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr TreeNode::getSibling() const
{
	return this->_sibling;
}